

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::setTags(TestCaseInfo *testCaseInfo,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *tags)

{
  SpecialProperties SVar1;
  int iVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  SpecialProperties SVar6;
  string lcaseTag;
  ostringstream oss;
  string local_1d0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(testCaseInfo->tags)._M_t,&tags->_M_t);
  local_1b0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&testCaseInfo->lcaseTags;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1b0);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  p_Var4 = (tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(tags->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      local_1d0._M_dataplus._M_p._0_1_ = 0x5b;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)&local_1d0,1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      local_1d0._M_dataplus._M_p._0_1_ = 0x5d;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1d0,1);
      toLower(&local_1d0,(string *)(p_Var4 + 1));
      SVar1 = testCaseInfo->properties;
      if ((local_1d0._M_string_length == 0) ||
         (SVar6 = IsHidden,
         *(char *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) != '.'
         )) {
        iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
        SVar6 = IsHidden;
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
            if (iVar2 == 0) {
              SVar6 = Throws;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
              if (iVar2 == 0) {
                SVar6 = ShouldFail;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
                if (iVar2 == 0) {
                  SVar6 = MayFail;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
                  SVar6 = (uint)(iVar2 == 0) << 5;
                }
              }
            }
          }
        }
      }
      testCaseInfo->properties = SVar6 | SVar1;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>(local_1b0,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
          &local_1d0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_))
        ;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&testCaseInfo->tagsAsString,(string *)&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
      &local_1d0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_));
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void setTags( TestCaseInfo& testCaseInfo, std::set<std::string> const& tags )
    {
        testCaseInfo.tags = tags;
        testCaseInfo.lcaseTags.clear();

        std::ostringstream oss;
        for( std::set<std::string>::const_iterator it = tags.begin(), itEnd = tags.end(); it != itEnd; ++it ) {
            oss << '[' << *it << ']';
            std::string lcaseTag = toLower( *it );
            testCaseInfo.properties = static_cast<TestCaseInfo::SpecialProperties>( testCaseInfo.properties | parseSpecialTag( lcaseTag ) );
            testCaseInfo.lcaseTags.insert( lcaseTag );
        }
        testCaseInfo.tagsAsString = oss.str();
    }